

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::Detail::rawMemoryToString_abi_cxx11_(void *object,size_t size)

{
  _Setfill<char> _Var1;
  Arch AVar2;
  _Setw _Var3;
  ReusableStringStream *value;
  int in_EDX;
  string *in_RDI;
  ReusableStringStream rss;
  uchar *bytes;
  int inc;
  int end;
  int i;
  ReusableStringStream *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  _Setfill<char> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_1c = 0;
  local_24 = 1;
  AVar2 = anon_unknown_0::Endianness::which();
  local_20 = in_EDX;
  if (AVar2 == Little) {
    local_1c = in_EDX + -1;
    local_24 = -1;
    local_20 = -1;
  }
  ReusableStringStream::ReusableStringStream
            ((ReusableStringStream *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  ReusableStringStream::operator<<
            ((ReusableStringStream *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (char (*) [3])in_stack_ffffffffffffff68);
  _Var1 = clara::std::setfill<char>('0');
  uVar4 = CONCAT13(_Var1._M_c,(int3)in_stack_ffffffffffffffb0);
  value = ReusableStringStream::operator<<
                    ((ReusableStringStream *)CONCAT17(_Var1._M_c,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
  ReusableStringStream::operator<<
            ((ReusableStringStream *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (_func_ios_base_ptr_ios_base_ptr *)in_stack_ffffffffffffff68);
  for (; local_1c != local_20; local_1c = local_24 + local_1c) {
    _Var3 = clara::std::setw(2);
    in_stack_ffffffffffffff68 =
         ReusableStringStream::operator<<
                   ((ReusableStringStream *)CONCAT17(_Var1._M_c,in_stack_ffffffffffffff80),
                    (_Setw *)value);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)CONCAT44(_Var3._M_n,in_stack_ffffffffffffff70),
               (uint *)in_stack_ffffffffffffff68);
  }
  ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff68);
  ReusableStringStream::~ReusableStringStream
            ((ReusableStringStream *)CONCAT44(in_stack_ffffffffffffffb4,uVar4));
  return in_RDI;
}

Assistant:

std::string rawMemoryToString( const void *object, std::size_t size ) {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>( size ), inc = 1;
        if( Endianness::which() == Endianness::Little ) {
            i = end-1;
            end = inc = -1;
        }

        unsigned char const *bytes = static_cast<unsigned char const *>(object);
        ReusableStringStream rss;
        rss << "0x" << std::setfill('0') << std::hex;
        for( ; i != end; i += inc )
             rss << std::setw(2) << static_cast<unsigned>(bytes[i]);
       return rss.str();
    }